

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cea708.c
# Opt level: O0

void cea708_dump(cea708_t *cea708)

{
  char *pcVar1;
  uint *in_RDI;
  uint16_t cc_data;
  cea708_cc_type_t type;
  int valid;
  int i;
  uint16_t in_stack_00000026;
  cea708_cc_type_t local_14;
  int local_10;
  uint local_c;
  uint *local_8;
  
  local_8 = in_RDI;
  fprintf(_stderr,"itu_t_t35_country_code_t %d\n",(ulong)*in_RDI);
  fprintf(_stderr,"itu_t_t35_provider_code_t %d\n",(ulong)local_8[1]);
  fprintf(_stderr,"user_identifier %c%c%c%c\n",(ulong)(local_8[2] >> 0x18),
          (ulong)(local_8[2] >> 0x10 & 0xff),(ulong)(local_8[2] >> 8 & 0xff),
          (ulong)(local_8[2] & 0xff));
  fprintf(_stderr,"user_data_type_code %d\n",(ulong)(byte)local_8[3]);
  fprintf(_stderr,"directv_user_data_length %d\n",(ulong)*(byte *)((long)local_8 + 0xd));
  fprintf(_stderr,"user_data.process_em_data_flag %d\n",(ulong)((ushort)local_8[4] & 1));
  fprintf(_stderr,"user_data.process_cc_data_flag %d\n",(ulong)((ushort)local_8[4] >> 1 & 1));
  fprintf(_stderr,"user_data.additional_data_flag %d\n",(ulong)((ushort)local_8[4] >> 2 & 1));
  fprintf(_stderr,"user_data.cc_count %d\n",(ulong)((ushort)local_8[4] >> 3 & 0x1f));
  fprintf(_stderr,"user_data.em_data %d\n",(ulong)(ushort)((ushort)local_8[4] >> 8));
  for (local_c = 0; (int)local_c < (int)(uint)((ushort)local_8[4] >> 3 & 0x1f);
      local_c = local_c + 1) {
    cea708_cc_data((user_data_t *)(local_8 + 4),local_c,&local_10,&local_14);
    if ((local_10 == 0) || (local_14 != cc_type_ntsc_cc_field_1)) {
      pcVar1 = "false";
      if ((local_8[(long)(int)local_c + 5] >> 5 & 1) != 0) {
        pcVar1 = "true";
      }
      fprintf(_stderr,"user_data.cc_data[%d] cc_valid: %s, cc_type: %d, cc_data: %04x\n",
              (ulong)local_c,pcVar1,(ulong)(local_8[(long)(int)local_c + 5] >> 6 & 3),
              (ulong)(local_8[(long)(int)local_c + 5] >> 8 & 0xffff));
    }
    else {
      eia608_dump(in_stack_00000026);
    }
  }
  return;
}

Assistant:

void cea708_dump(cea708_t* cea708)
{
    int i;

    fprintf(stderr, "itu_t_t35_country_code_t %d\n", cea708->country);
    fprintf(stderr, "itu_t_t35_provider_code_t %d\n", cea708->provider);
    fprintf(stderr, "user_identifier %c%c%c%c\n",
        (cea708->user_identifier >> 24) & 0xFF, (cea708->user_identifier >> 16) & 0xFF,
        (cea708->user_identifier >> 8) & 0xFF, cea708->user_identifier & 0xFF);
    fprintf(stderr, "user_data_type_code %d\n", cea708->user_data_type_code);
    fprintf(stderr, "directv_user_data_length %d\n", cea708->directv_user_data_length);
    fprintf(stderr, "user_data.process_em_data_flag %d\n", cea708->user_data.process_em_data_flag);
    fprintf(stderr, "user_data.process_cc_data_flag %d\n", cea708->user_data.process_cc_data_flag);
    fprintf(stderr, "user_data.additional_data_flag %d\n", cea708->user_data.additional_data_flag);
    fprintf(stderr, "user_data.cc_count %d\n", cea708->user_data.cc_count);
    fprintf(stderr, "user_data.em_data %d\n", cea708->user_data.em_data);

    for (i = 0; i < (int)cea708->user_data.cc_count; ++i) {
        int valid;
        cea708_cc_type_t type;
        uint16_t cc_data = cea708_cc_data(&cea708->user_data, i, &valid, &type);

        if (valid && cc_type_ntsc_cc_field_1 == type) {
            eia608_dump(cc_data);
        } else {
            fprintf(stderr, "user_data.cc_data[%d] cc_valid: %s, cc_type: %d, cc_data: %04x\n", i, cea708->user_data.cc_data[i].cc_valid ? "true" : "false", cea708->user_data.cc_data[i].cc_type, cea708->user_data.cc_data[i].cc_data);
        }
    }
}